

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryMLT.hpp
# Opt level: O2

uint32_t __thiscall
ddd::DictionaryMLT<false,_true>::new_suffix_id_(DictionaryMLT<false,_true> *this)

{
  long lVar1;
  long lVar2;
  __uniq_ptr_impl<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
  __p;
  tuple<ddd::DaTrie<false,_true,_false>_*,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
  in_RAX;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  __uniq_ptr_impl<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
  local_28;
  
  uVar6 = *(uint *)(this + 0x28);
  if ((ulong)uVar6 == 0xffffffff) {
    lVar1 = *(long *)(this + 0x10);
    lVar2 = *(long *)(this + 0x18);
    make_unique<ddd::DaTrie<false,true,false>>();
    std::
    vector<std::unique_ptr<ddd::DaTrie<false,true,false>,std::default_delete<ddd::DaTrie<false,true,false>>>,std::allocator<std::unique_ptr<ddd::DaTrie<false,true,false>,std::default_delete<ddd::DaTrie<false,true,false>>>>>
    ::
    emplace_back<std::unique_ptr<ddd::DaTrie<false,true,false>,std::default_delete<ddd::DaTrie<false,true,false>>>>
              ((vector<std::unique_ptr<ddd::DaTrie<false,true,false>,std::default_delete<ddd::DaTrie<false,true,false>>>,std::allocator<std::unique_ptr<ddd::DaTrie<false,true,false>,std::default_delete<ddd::DaTrie<false,true,false>>>>>
                *)(this + 0x10),
               (unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
                *)&local_28);
    uVar6 = (uint)((ulong)(lVar2 - lVar1) >> 3);
    std::
    unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
    ::~unique_ptr((unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
                   *)&local_28);
  }
  else {
    local_28._M_t.
    super__Tuple_impl<0UL,_ddd::DaTrie<false,_true,_false>_*,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
    .super__Head_base<0UL,_ddd::DaTrie<false,_true,_false>_*,_false>._M_head_impl =
         (tuple<ddd::DaTrie<false,_true,_false>_*,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
          )(tuple<ddd::DaTrie<false,_true,_false>_*,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
            )in_RAX.
             super__Tuple_impl<0UL,_ddd::DaTrie<false,_true,_false>_*,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
             .super__Head_base<0UL,_ddd::DaTrie<false,_true,_false>_*,_false>._M_head_impl;
    make_unique<ddd::DaTrie<false,true,false>>();
    __p._M_t.
    super__Tuple_impl<0UL,_ddd::DaTrie<false,_true,_false>_*,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
    .super__Head_base<0UL,_ddd::DaTrie<false,_true,_false>_*,_false>._M_head_impl =
         local_28._M_t.
         super__Tuple_impl<0UL,_ddd::DaTrie<false,_true,_false>_*,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
         .super__Head_base<0UL,_ddd::DaTrie<false,_true,_false>_*,_false>._M_head_impl;
    local_28._M_t.
    super__Tuple_impl<0UL,_ddd::DaTrie<false,_true,_false>_*,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
    .super__Head_base<0UL,_ddd::DaTrie<false,_true,_false>_*,_false>._M_head_impl =
         (tuple<ddd::DaTrie<false,_true,_false>_*,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
          )(_Tuple_impl<0UL,_ddd::DaTrie<false,_true,_false>_*,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
            )0x0;
    std::
    __uniq_ptr_impl<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
    ::reset((__uniq_ptr_impl<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
             *)((ulong)uVar6 * 8 + *(long *)(this + 0x10)),
            (pointer)__p._M_t.
                     super__Tuple_impl<0UL,_ddd::DaTrie<false,_true,_false>_*,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
                     .super__Head_base<0UL,_ddd::DaTrie<false,_true,_false>_*,_false>._M_head_impl);
    std::
    unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
    ::~unique_ptr((unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
                   *)&local_28);
    uVar4 = *(uint *)(this + 0x28);
    uVar5 = (ulong)uVar4;
    do {
      uVar3 = (int)uVar5 + 1;
      uVar5 = (ulong)uVar3;
      if ((ulong)(*(long *)(this + 0x18) - *(long *)(this + 0x10) >> 3) <= uVar5) goto LAB_0012c7e6;
    } while (*(long *)(*(long *)(this + 0x10) + uVar5 * 8) != 0);
    *(uint *)(this + 0x28) = uVar3;
    uVar4 = uVar3;
LAB_0012c7e6:
    if (uVar4 == uVar6) {
      *(undefined4 *)(this + 0x28) = 0xffffffff;
    }
  }
  return uVar6;
}

Assistant:

uint32_t new_suffix_id_() {
    if (suffix_head_ == NOT_FOUND) {
      auto suffix_id = static_cast<uint32_t>(suffix_subtries_.size());
      suffix_subtries_.push_back(make_unique<SuffixTrieType>());
      return suffix_id;
    }

    auto suffix_id = suffix_head_;
    suffix_subtries_[suffix_id] = make_unique<SuffixTrieType>();

    for (auto i = suffix_head_ + 1; i < suffix_subtries_.size(); ++i) {
      if (!suffix_subtries_[i]) {
        suffix_head_ = i;
        break;
      }
    }
    if (suffix_head_ == suffix_id) {
      suffix_head_ = NOT_FOUND;
    }
    return suffix_id;
  }